

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O0

int nn_bipc_create(nn_ep *ep)

{
  nn_ctx *ctx;
  nn_ep *in_RDI;
  int rc;
  nn_bipc *self;
  nn_bipc *in_stack_000000b8;
  int src;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  nn_ctx *fn;
  int local_4;
  
  ctx = (nn_ctx *)nn_alloc_(0x1678d3);
  if (ctx != (nn_ctx *)0x0) {
    *(nn_ep **)((long)&ctx[1].sync.mutex + 8) = in_RDI;
    nn_ep_tran_setup(in_RDI,&nn_bipc_ep_ops,ctx);
    fn = ctx;
    nn_ep_getctx((nn_ep *)0x167966);
    nn_fsm_init_root(&in_RDI->fsm,(nn_fsm_fn)fn,
                     (nn_fsm_fn)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),ctx);
    src = (int)((ulong)ctx >> 0x20);
    fn[1].sync.mutex.__data.__lock = 1;
    *(undefined8 *)((long)&fn[8].sync.mutex + 8) = 0;
    nn_list_init((nn_list *)((long)&fn[8].sync.mutex + 0x10));
    nn_fsm_start((nn_fsm *)0x1679b7);
    nn_usock_init((nn_usock *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),src,
                  (nn_fsm *)0x1679cf);
    local_4 = nn_bipc_listen(in_stack_000000b8);
    if (local_4 == 0) {
      local_4 = 0;
    }
    return local_4;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
          ,0x62);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_bipc_create (struct nn_ep *ep)
{
    struct nn_bipc *self;
    int rc;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_bipc), "bipc");
    alloc_assert (self);


    /*  Initialise the structure. */
    self->ep = ep;
    nn_ep_tran_setup (ep, &nn_bipc_ep_ops, self);
    nn_fsm_init_root (&self->fsm, nn_bipc_handler, nn_bipc_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_BIPC_STATE_IDLE;
    self->aipc = NULL;
    nn_list_init (&self->aipcs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    nn_usock_init (&self->usock, NN_BIPC_SRC_USOCK, &self->fsm);

    rc = nn_bipc_listen (self);
    if (rc != 0) {
        return rc;
    }

    return 0;
}